

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeCodeData.cpp
# Opt level: O2

void NativeCodeData::AddFixupEntry
               (void *targetAddr,void *targetStartAddr,void *addrToFixup,void *startAddress,
               DataChunk *chunkList)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  DataChunk *pDVar4;
  DataChunk *pDVar5;
  HANDLE hHeap;
  NativeDataFixupEntry *pNVar6;
  uint uVar7;
  
  if (addrToFixup < startAddress) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeData.cpp"
                       ,0x2a,"(addrToFixup >= startAddress)","addrToFixup >= startAddress");
    if (!bVar2) goto LAB_0058a5bc;
    *puVar3 = 0;
  }
  if (((ulong)addrToFixup & 7) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeData.cpp"
                       ,0x2b,"(((long)addrToFixup) % sizeof(void*) == 0)",
                       "((__int64)addrToFixup) % sizeof(void*) == 0");
    if (!bVar2) goto LAB_0058a5bc;
    *puVar3 = 0;
  }
  if (targetAddr != (void *)0x0) {
    if (targetStartAddr == (void *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeData.cpp"
                         ,0x32,"(targetStartAddr)","targetStartAddr");
      if (!bVar2) goto LAB_0058a5bc;
      *puVar3 = 0;
    }
    uVar7 = (int)targetAddr - (int)targetStartAddr;
    pDVar4 = GetDataChunk(targetStartAddr);
    if (pDVar4->len < uVar7) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeData.cpp"
                         ,0x36,"(targetChunk->len >= inDataOffset)",
                         "targetChunk->len >= inDataOffset");
      if (!bVar2) goto LAB_0058a5bc;
      *puVar3 = 0;
    }
    if (DAT_014302ea == '\x01') {
      bVar2 = false;
      for (; chunkList != (DataChunk *)0x0; chunkList = chunkList->next) {
        bVar2 = (bool)(bVar2 | chunkList == pDVar4);
      }
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeData.cpp"
                           ,0x41,"(foundTargetChunk)",
                           "current pointer is not allocated with NativeCodeData allocator?");
        if (!bVar2) goto LAB_0058a5bc;
        *puVar3 = 0;
      }
    }
    pDVar5 = GetDataChunk(startAddress);
    hHeap = GetProcessHeap();
    pNVar6 = (NativeDataFixupEntry *)HeapAlloc(hHeap,0,0x10);
    if (pNVar6 == (NativeDataFixupEntry *)0x0) {
      Js::Throw::OutOfMemory();
    }
    pNVar6->addrOffset = (uint)((long)addrToFixup - (long)startAddress);
    if ((ulong)pDVar5->len - 8 < ((long)addrToFixup - (long)startAddress & 0xffffffffU)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeData.cpp"
                         ,0x4e,"(entry->addrOffset <= chunk->len - sizeof(void*))",
                         "entry->addrOffset <= chunk->len - sizeof(void*)");
      if (!bVar2) {
LAB_0058a5bc:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    pNVar6->targetTotalOffset = uVar7 + pDVar4->offset;
    pNVar6->next = pDVar5->fixupList;
    pDVar5->fixupList = pNVar6;
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,NativeCodeDataPhase);
    if (bVar2) {
      Output::Print(L"NativeCodeData Add Fixup: %p(%p+%d, chunk:%p)  -->  %p(chunk:%p)  %S\n",
                    addrToFixup,startAddress,(ulong)pNVar6->addrOffset,pDVar5,targetAddr,pDVar4,
                    pDVar5->dataType);
    }
  }
  return;
}

Assistant:

void
NativeCodeData::AddFixupEntry(void* targetAddr, void* targetStartAddr, void* addrToFixup, void* startAddress, DataChunk * chunkList)
{
    Assert(addrToFixup >= startAddress);
    Assert(((__int64)addrToFixup) % sizeof(void*) == 0);

    if (targetAddr == nullptr)
    {
        return;
    }

    Assert(targetStartAddr);

    unsigned int inDataOffset = (unsigned int)((char*)targetAddr - (char*)targetStartAddr);
    DataChunk* targetChunk = NativeCodeData::GetDataChunk(targetStartAddr);
    Assert(targetChunk->len >= inDataOffset);

#if DBG
    if (CONFIG_FLAG(OOPJITFixupValidate))
    {
        bool foundTargetChunk = false;
        while (chunkList)
        {
            foundTargetChunk |= (chunkList == targetChunk);
            chunkList = chunkList->next;
        }
        AssertMsg(foundTargetChunk, "current pointer is not allocated with NativeCodeData allocator?"); // change to valid check instead of assertion?
    }
#endif

    DataChunk* chunk = NativeCodeData::GetDataChunk(startAddress);

    NativeDataFixupEntry* entry = (NativeDataFixupEntry*)midl_user_allocate(sizeof(NativeDataFixupEntry));
    if (!entry)
    {
        Js::Throw::OutOfMemory();
    }
    __analysis_assume(entry);
    entry->addrOffset = (unsigned int)((__int64)addrToFixup - (__int64)startAddress);
    Assert(entry->addrOffset <= chunk->len - sizeof(void*));

    entry->targetTotalOffset = targetChunk->offset + inDataOffset;
    entry->next = chunk->fixupList;
    chunk->fixupList = entry;

#if DBG
    if (PHASE_TRACE1(Js::NativeCodeDataPhase))
    {
        Output::Print(_u("NativeCodeData Add Fixup: %p(%p+%d, chunk:%p)  -->  %p(chunk:%p)  %S\n"),
            addrToFixup, startAddress, entry->addrOffset, (void*)chunk, targetAddr, (void*)targetChunk, chunk->dataType);
    }
#endif
}